

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionTestCase.cpp
# Opt level: O0

Logout * anon_unknown.dwarf_2926b4::createT11Logout
                   (Logout *__return_storage_ptr__,char *sender,char *target,int seq)

{
  int iVar1;
  Header *pHVar2;
  Trailer *this;
  FieldBase local_240;
  FieldBase local_1e8;
  undefined1 local_180 [8];
  Logout logout;
  int seq_local;
  char *target_local;
  char *sender_local;
  
  logout.super_Message._340_4_ = seq;
  FIXT11::Logout::Logout((Logout *)local_180);
  pHVar2 = FIXT11::Message::getHeader((Message *)local_180);
  fillHeader((Header *)pHVar2,sender,target,logout.super_Message._340_4_);
  pHVar2 = FIXT11::Message::getHeader((Message *)local_180);
  iVar1 = FIX::Message::bodyLength((Message *)local_180,8,9,10);
  FIX::BodyLength::BodyLength((BodyLength *)&local_1e8,iVar1);
  FIX::FieldMap::setField((FieldMap *)pHVar2,&local_1e8,true);
  FIX::BodyLength::~BodyLength((BodyLength *)&local_1e8);
  this = FIXT11::Message::getTrailer((Message *)local_180);
  iVar1 = FIX::Message::checkSum((Message *)local_180,10);
  FIX::CheckSum::CheckSum((CheckSum *)&local_240,iVar1);
  FIX::FieldMap::setField((FieldMap *)this,&local_240,true);
  FIX::CheckSum::~CheckSum((CheckSum *)&local_240);
  FIX42::Logout::Logout(__return_storage_ptr__,(Message *)local_180);
  FIXT11::Logout::~Logout((Logout *)local_180);
  return __return_storage_ptr__;
}

Assistant:

FIX42::Logout createT11Logout(const char *sender, const char *target, int seq) {
  FIXT11::Logout logout;
  fillHeader(logout.getHeader(), sender, target, seq);
  logout.getHeader().setField(BodyLength(logout.bodyLength()));
  logout.getTrailer().setField(CheckSum(logout.checkSum()));
  return logout;
}